

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

int Mpm_ObjAddCutToStore(Mpm_Man_t *p,Mpm_Cut_t *pCut,int ArrTime)

{
  Mpm_Uni_t *pMVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Mpm_Par_t *pMVar7;
  Mpm_Uni_t *pMVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  void **ppvVar12;
  long lVar13;
  Mpm_Uni_t **ppMVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  
  lVar10 = (long)(p->vFreeUnits).nSize;
  if (lVar10 < 1) goto LAB_0047bd61;
  pMVar1 = (Mpm_Uni_t *)(p->vFreeUnits).pArray[lVar10 + -1];
  if (&pMVar1->pCut != pCut) {
    __assert_fail("&pUnit->pCut == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0xb8,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  piVar2 = (p->vMigRefs).pArray;
  piVar3 = (p->vMapRefs).pArray;
  piVar4 = (p->vEstRefs).pArray;
  piVar5 = (p->vAreas).pArray;
  piVar6 = (p->vEdges).pArray;
  pMVar1->mTime = ArrTime;
  pMVar7 = p->pPars;
  if (pMVar7->fMap4Cnf == 0) {
    if (pMVar7->fMap4Aig != 0) {
      iVar9 = *(int *)((long)&p->pDsd6->nAnds +
                      (ulong)((*(uint *)&pCut->field_0x4 & 0x1fffffe) << 4));
      goto LAB_0047b816;
    }
    iVar9 = 0x14;
    if (pMVar7->fMap4Gates == 0) {
      iVar9 = p->pLibLut->pLutAreas[*(uint *)&pCut->field_0x4 >> 0x1b];
    }
  }
  else {
    iVar9 = *(int *)((long)&p->pDsd6->nClauses +
                    (ulong)((*(uint *)&pCut->field_0x4 & 0x1fffffe) << 4));
LAB_0047b816:
    iVar9 = iVar9 * 0x14;
  }
  pMVar1->mArea = iVar9;
  pMVar1->mEdge = (*(uint *)&pCut->field_0x4 >> 0x1b) * 0x32;
  *(undefined8 *)&pMVar1->mAveRefs = 0;
  *(undefined8 *)((long)&pMVar1->uSign + 4) = 0;
  if (*(uint *)&pCut->field_0x4 < 0x8000000) {
    uVar15 = *(uint *)&pCut->field_0x4 >> 0x1b;
  }
  else {
    uVar17 = 0;
    do {
      if (pCut->pLeaves[uVar17] < 0) {
LAB_0047bd23:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar15 = (uint)pCut->pLeaves[uVar17] >> 1;
      iVar9 = p->fMainRun;
      if ((iVar9 == 0) || (piVar3[uVar15] != 0)) {
        iVar19 = piVar4[uVar15];
        if (iVar19 < 1) {
          __assert_fail("pEstRefs[iLeaf] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                        ,200,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
        }
        pMVar1->mArea = pMVar1->mArea + (piVar5[uVar15] * 100) / iVar19;
        pMVar1->mEdge = pMVar1->mEdge + (piVar6[uVar15] * 100) / piVar4[uVar15];
        piVar11 = piVar3;
        if (iVar9 == 0) {
          piVar11 = piVar2;
        }
        pMVar1->mAveRefs = pMVar1->mAveRefs + piVar11[uVar15];
      }
      else {
        pMVar1->mArea = pMVar1->mArea + piVar5[uVar15];
        pMVar1->mEdge = pMVar1->mEdge + piVar6[uVar15];
      }
      pMVar1->uSign = pMVar1->uSign | 1L << ((byte)uVar15 & 0x3f);
      uVar17 = uVar17 + 1;
      uVar15 = *(uint *)&pCut->field_0x4 >> 0x1b;
    } while (uVar17 < uVar15);
  }
  uVar18 = 1;
  if (1 < uVar15) {
    uVar18 = uVar15;
  }
  pMVar1->mAveRefs = (pMVar1->mAveRefs * 0x32) / (int)uVar18;
  if (0x3fffffff < ArrTime) {
    __assert_fail("pUnit->mTime <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0xd0,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < pMVar1->mArea) {
    __assert_fail("pUnit->mArea <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0xd1,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < pMVar1->mEdge) {
    __assert_fail("pUnit->mEdge <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0xd2,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  iVar9 = p->nCutStore;
  if ((long)iVar9 == 0) {
    p->nCutStore = 1;
    p->pCutStore[0] = pMVar1;
    iVar9 = (p->vFreeUnits).nSize;
    if (iVar9 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    (p->vFreeUnits).nSize = iVar9 + -1;
    return 1;
  }
  if ((iVar9 == p->nNumCuts + -1) &&
     (iVar9 = (*p->pCutCmp)(pMVar1,p->pCutStore[(long)iVar9 + -1]), 0 < iVar9)) {
    return 0;
  }
  uVar15 = p->nCutStore;
  uVar17 = (ulong)uVar15;
  if (p->nNumCuts < (int)uVar15) {
    __assert_fail("p->nCutStore <= p->nNumCuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0xfb,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  ppMVar14 = p->pCutStore + (uVar17 - 1);
  do {
    uVar24 = (uint)uVar17;
    uVar18 = (int)uVar15 >> 0x1f & uVar15;
    if ((int)uVar24 < 1) break;
    iVar9 = (*p->pCutCmp)(pMVar1,*ppMVar14);
    uVar17 = (ulong)(uVar24 - 1);
    ppMVar14 = ppMVar14 + -1;
    uVar18 = uVar24;
  } while (iVar9 < 1);
  if (0 < (int)uVar18) {
    uVar17 = 0;
    do {
      pMVar8 = p->pCutStore[uVar17];
      if ((*(uint *)&(pMVar8->pCut).field_0x4 >> 0x1b <= *(uint *)&(pMVar1->pCut).field_0x4 >> 0x1b)
         && ((pMVar8->uSign & ~pMVar1->uSign) == 0)) {
        uVar15 = *(uint *)&(pMVar8->pCut).field_0x4;
        if (uVar15 < 0x8000000) {
          return 0;
        }
        uVar21 = 0;
        while( true ) {
          uVar24 = (pMVar8->pCut).pLeaves[uVar21];
          if ((int)uVar24 < 0) goto LAB_0047bd23;
          uVar16 = *(uint *)&(pMVar1->pCut).field_0x4;
          uVar22 = uVar16 >> 0x1b;
          uVar20 = 0;
          if (0x7ffffff < uVar16) {
            uVar23 = 0;
            do {
              uVar16 = (pMVar1->pCut).pLeaves[uVar23];
              if ((int)uVar16 < 0) goto LAB_0047bd23;
              uVar20 = uVar23;
            } while ((1 < (uVar16 ^ uVar24)) &&
                    (uVar23 = uVar23 + 1, uVar20 = (ulong)uVar22, uVar22 != uVar23));
          }
          if ((uint)uVar20 == uVar22) break;
          uVar21 = uVar21 + 1;
          if (uVar21 == uVar15 >> 0x1b) {
            return 0;
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar18);
  }
  if (((p->pCutStore[0]->pCut).field_0x7 & 4) != 0) {
    uVar18 = uVar18 & (*(int *)&(pMVar1->pCut).field_0x4 << 5) >> 0x1f;
  }
  iVar9 = (p->vFreeUnits).nSize;
  if ((long)iVar9 < 1) {
LAB_0047bd61:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  if (pMVar1 != (Mpm_Uni_t *)(p->vFreeUnits).pArray[(long)iVar9 + -1]) {
    __assert_fail("pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x11a,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  (p->vFreeUnits).nSize = iVar9 + -1;
  iVar9 = p->nCutStore;
  lVar10 = (long)iVar9;
  p->nCutStore = iVar9 + 1;
  if ((int)uVar18 < iVar9) {
    do {
      p->pCutStore[lVar10] = p->pCutStore[lVar10 + -1];
      lVar10 = lVar10 + -1;
    } while ((int)uVar18 < lVar10);
  }
  p->pCutStore[(int)uVar18] = pMVar1;
  iVar9 = uVar18 + 1;
  if (iVar9 < p->nCutStore) {
    lVar10 = (long)iVar9;
    do {
      pMVar8 = p->pCutStore[lVar10];
      if ((*(uint *)&(pMVar8->pCut).field_0x4 >> 0x1b < *(uint *)&(pMVar1->pCut).field_0x4 >> 0x1b)
         || ((pMVar1->uSign & ~pMVar8->uSign) != 0)) {
LAB_0047bb6f:
        lVar13 = (long)iVar9;
        iVar9 = iVar9 + 1;
        ppMVar14 = p->pCutStore + lVar13;
      }
      else {
        uVar15 = *(uint *)&(pMVar1->pCut).field_0x4;
        if (0x7ffffff < uVar15) {
          uVar17 = 0;
          do {
            uVar18 = (pMVar1->pCut).pLeaves[uVar17];
            if ((int)uVar18 < 0) goto LAB_0047bd23;
            uVar24 = *(uint *)&(pMVar8->pCut).field_0x4;
            uVar16 = uVar24 >> 0x1b;
            uVar21 = 0;
            if (0x7ffffff < uVar24) {
              uVar20 = 0;
              do {
                uVar24 = (pMVar8->pCut).pLeaves[uVar20];
                if ((int)uVar24 < 0) goto LAB_0047bd23;
                uVar21 = uVar20;
              } while ((1 < (uVar24 ^ uVar18)) &&
                      (uVar20 = uVar20 + 1, uVar21 = (ulong)uVar16, uVar16 != uVar20));
            }
            if ((uint)uVar21 == uVar16) goto LAB_0047bb6f;
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar15 >> 0x1b);
        }
        uVar15 = (p->vFreeUnits).nCap;
        if ((p->vFreeUnits).nSize == uVar15) {
          if ((int)uVar15 < 0x10) {
            ppvVar12 = (p->vFreeUnits).pArray;
            if (ppvVar12 == (void **)0x0) {
              ppvVar12 = (void **)malloc(0x80);
            }
            else {
              ppvVar12 = (void **)realloc(ppvVar12,0x80);
            }
            iVar19 = 0x10;
          }
          else {
            iVar19 = uVar15 * 2;
            if (iVar19 <= (int)uVar15) goto LAB_0047bbdf;
            ppvVar12 = (p->vFreeUnits).pArray;
            if (ppvVar12 == (void **)0x0) {
              ppvVar12 = (void **)malloc((ulong)uVar15 << 4);
            }
            else {
              ppvVar12 = (void **)realloc(ppvVar12,(ulong)uVar15 << 4);
            }
          }
          (p->vFreeUnits).pArray = ppvVar12;
          (p->vFreeUnits).nCap = iVar19;
        }
LAB_0047bbdf:
        iVar19 = (p->vFreeUnits).nSize;
        (p->vFreeUnits).nSize = iVar19 + 1;
        ppMVar14 = (Mpm_Uni_t **)((p->vFreeUnits).pArray + iVar19);
      }
      *ppMVar14 = pMVar8;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nCutStore);
  }
  p->nCutStore = iVar9;
  if (iVar9 != p->nNumCuts) goto LAB_0047bcf9;
  p->nCutStore = iVar9 + -1;
  pMVar1 = p->pCutStore[(long)iVar9 + -1];
  uVar15 = (p->vFreeUnits).nCap;
  if ((p->vFreeUnits).nSize == uVar15) {
    if ((int)uVar15 < 0x10) {
      ppvVar12 = (p->vFreeUnits).pArray;
      if (ppvVar12 == (void **)0x0) {
        ppvVar12 = (void **)malloc(0x80);
      }
      else {
        ppvVar12 = (void **)realloc(ppvVar12,0x80);
      }
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar15 * 2;
      if (iVar9 <= (int)uVar15) goto LAB_0047bcde;
      ppvVar12 = (p->vFreeUnits).pArray;
      if (ppvVar12 == (void **)0x0) {
        ppvVar12 = (void **)malloc((ulong)uVar15 << 4);
      }
      else {
        ppvVar12 = (void **)realloc(ppvVar12,(ulong)uVar15 << 4);
      }
    }
    (p->vFreeUnits).pArray = ppvVar12;
    (p->vFreeUnits).nCap = iVar9;
  }
LAB_0047bcde:
  iVar9 = (p->vFreeUnits).nSize;
  (p->vFreeUnits).nSize = iVar9 + 1;
  (p->vFreeUnits).pArray[iVar9] = pMVar1;
LAB_0047bcf9:
  if (p->nNumCuts <= p->nCutStore) {
    __assert_fail("p->nCutStore < p->nNumCuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x13b,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  return 1;
}

Assistant:

int Mpm_ObjAddCutToStore( Mpm_Man_t * p, Mpm_Cut_t * pCut, int ArrTime )
{
    int fEnableContainment = 1;
    Mpm_Uni_t * pUnit, * pUnitNew;
    int k, iPivot, last;
    // create new unit
#ifdef MIG_RUNTIME
    abctime clk;
clk = Abc_Clock();
#endif
    pUnitNew = Mpm_CutSetupInfo( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeEval += Abc_Clock() - clk;
#endif
    // special case when the cut store is empty
    if ( p->nCutStore == 0 )
    {
        p->pCutStore[p->nCutStore++] = pUnitNew;
        Vec_PtrPop( &p->vFreeUnits );
        return 1;
    }
    // special case when the cut store is full and last cut is better than new cut
    if ( p->nCutStore == p->nNumCuts-1 && p->pCutCmp(pUnitNew, p->pCutStore[p->nCutStore-1]) > 0 )
        return 0;

    // find place of the given cut in the store
    assert( p->nCutStore <= p->nNumCuts );
    for ( iPivot = p->nCutStore - 1; iPivot >= 0; iPivot-- )
        if ( p->pCutCmp(pUnitNew, p->pCutStore[iPivot]) > 0 ) // iPivot-th cut is better than new cut
            break;

    if ( fEnableContainment )
    {
#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
        // filter this cut using other cuts
        for ( k = 0; k <= iPivot; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves >= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnit->uSign && 
                 Mpm_CutIsContained(p, &pUnitNew->pCut, &pUnit->pCut) )
            {
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
                return 0;
            }
        }
    }

    // special case when the best cut is useless while the new cut is not
    if ( p->pCutStore[0]->pCut.fUseless && !pUnitNew->pCut.fUseless )
        iPivot = -1;

    // add the cut to storage
    assert( pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits) );
    Vec_PtrPop( &p->vFreeUnits );

    // insert this cut at location iPivot
    iPivot++;
    for ( k = p->nCutStore++; k > iPivot; k-- )
        p->pCutStore[k] = p->pCutStore[k-1];
    p->pCutStore[iPivot] = pUnitNew;

    if ( fEnableContainment )
    {
        // filter other cuts using this cut
        for ( k = last = iPivot+1; k < p->nCutStore; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves <= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnitNew->uSign && 
                 Mpm_CutIsContained(p, &pUnit->pCut, &pUnitNew->pCut) )
            {
                Vec_PtrPush( &p->vFreeUnits, pUnit );
                continue;
            }
            p->pCutStore[last++] = p->pCutStore[k];
        }
        p->nCutStore = last;
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
    }

    // remove the last cut if too many
    if ( p->nCutStore == p->nNumCuts )
        Vec_PtrPush( &p->vFreeUnits, p->pCutStore[--p->nCutStore] );
    assert( p->nCutStore < p->nNumCuts );
    return 1;
}